

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O0

bool __thiscall
Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::operator==
          (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *this,
          Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *o)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *l;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *in_RSI;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *in_RDI;
  size_t i;
  size_t sz;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *in_stack_ffffffffffffffb8;
  size_t local_28;
  bool local_1;
  
  sVar2 = size(in_RDI);
  sVar3 = size(in_RSI);
  if (sVar2 == sVar3) {
    sVar2 = size(in_RDI);
    for (local_28 = 0; local_28 != sVar2; local_28 = local_28 + 1) {
      l = operator[](in_RDI,local_28);
      operator[](in_RSI,local_28);
      bVar1 = Kernel::operator!=(l,in_stack_ffffffffffffffb8);
      if (bVar1) {
        return false;
      }
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool operator==(const Stack& o) const
  {
    if(size()!=o.size()) {
      return false;
    }
    size_t sz = size();
    for(size_t i=0; i!=sz; ++i) {
      if((*this)[i]!=o[i]) {
	return false;
      }
    }
    return true;
  }